

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

bool __thiscall
jrtplib::RTPUDPv6Transmitter::ComesFromThisTransmitter(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  undefined1 auVar5 [16];
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  in6_addr itip;
  
  bVar4 = false;
  if ((addr != (RTPAddress *)0x0) && (this->init != false)) {
    if ((this->created == true) && (addr->addresstype == IPv6Address)) {
      p_Var3 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      bVar4 = false;
      while (!bVar4) {
        if (p_Var3 == (_List_node_base *)&this->localIPs) goto LAB_0012a73f;
        uVar1 = *(undefined8 *)&addr->field_0xc;
        uVar2 = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4);
        local_28 = (char)uVar1;
        cStack_27 = (char)((ulong)uVar1 >> 8);
        cStack_26 = (char)((ulong)uVar1 >> 0x10);
        cStack_25 = (char)((ulong)uVar1 >> 0x18);
        cStack_24 = (char)((ulong)uVar1 >> 0x20);
        cStack_23 = (char)((ulong)uVar1 >> 0x28);
        cStack_22 = (char)((ulong)uVar1 >> 0x30);
        cStack_21 = (char)((ulong)uVar1 >> 0x38);
        cStack_20 = (char)uVar2;
        cStack_1f = (char)((ulong)uVar2 >> 8);
        cStack_1e = (char)((ulong)uVar2 >> 0x10);
        cStack_1d = (char)((ulong)uVar2 >> 0x18);
        cStack_1c = (char)((ulong)uVar2 >> 0x20);
        cStack_1b = (char)((ulong)uVar2 >> 0x28);
        cStack_1a = (char)((ulong)uVar2 >> 0x30);
        cStack_19 = (char)((ulong)uVar2 >> 0x38);
        auVar5[0] = -(*(char *)&p_Var3[1]._M_next == local_28);
        auVar5[1] = -(*(char *)((long)&p_Var3[1]._M_next + 1) == cStack_27);
        auVar5[2] = -(*(char *)((long)&p_Var3[1]._M_next + 2) == cStack_26);
        auVar5[3] = -(*(char *)((long)&p_Var3[1]._M_next + 3) == cStack_25);
        auVar5[4] = -(*(char *)((long)&p_Var3[1]._M_next + 4) == cStack_24);
        auVar5[5] = -(*(char *)((long)&p_Var3[1]._M_next + 5) == cStack_23);
        auVar5[6] = -(*(char *)((long)&p_Var3[1]._M_next + 6) == cStack_22);
        auVar5[7] = -(*(char *)((long)&p_Var3[1]._M_next + 7) == cStack_21);
        auVar5[8] = -(*(char *)&p_Var3[1]._M_prev == cStack_20);
        auVar5[9] = -(*(char *)((long)&p_Var3[1]._M_prev + 1) == cStack_1f);
        auVar5[10] = -(*(char *)((long)&p_Var3[1]._M_prev + 2) == cStack_1e);
        auVar5[0xb] = -(*(char *)((long)&p_Var3[1]._M_prev + 3) == cStack_1d);
        auVar5[0xc] = -(*(char *)((long)&p_Var3[1]._M_prev + 4) == cStack_1c);
        auVar5[0xd] = -(*(char *)((long)&p_Var3[1]._M_prev + 5) == cStack_1b);
        auVar5[0xe] = -(*(char *)((long)&p_Var3[1]._M_prev + 6) == cStack_1a);
        auVar5[0xf] = -(*(char *)((long)&p_Var3[1]._M_prev + 7) == cStack_19);
        bVar4 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff;
        if (!bVar4) {
          p_Var3 = p_Var3->_M_next;
        }
      }
      bVar4 = true;
      if (*(ushort *)&addr[1].field_0xc != this->portbase) {
        return this->portbase + 1 == (uint)*(ushort *)&addr[1].field_0xc;
      }
    }
    else {
LAB_0012a73f:
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool RTPUDPv6Transmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (created && addr->GetAddressType() == RTPAddress::IPv6Address)
	{	
		const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
		bool found = false;
		std::list<in6_addr>::const_iterator it;
	
		it = localIPs.begin();
		while (!found && it != localIPs.end())
		{
			in6_addr itip = *it;
			in6_addr addrip = addr2->GetIP();
			if (memcmp(&addrip,&itip,sizeof(in6_addr)) == 0)
				found = true;
			else
				++it;
		}
	
		if (!found)
			v = false;
		else
		{
			if (addr2->GetPort() == portbase) // check for RTP port
				v = true;
			else if (addr2->GetPort() == (portbase+1)) // check for RTCP port
				v = true;
			else 
				v = false;
		}
	}
	else
		v = false;

	MAINMUTEX_UNLOCK
	return v;
}